

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void WriteFramePPM(GB *gb,char *filename)

{
  uint uVar1;
  byte bVar2;
  _Setw _Var3;
  ostream *poVar4;
  runtime_error *prVar5;
  int r;
  int g;
  int b;
  u32 pixel;
  u8 *data;
  u8 y;
  undefined8 uStack_2a8;
  u8 x;
  u32 colors [4];
  allocator local_289;
  string local_288 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [48];
  long local_218;
  ofstream file;
  char *filename_local;
  GB *gb_local;
  
  std::ofstream::ofstream(&local_218,filename,_S_out);
  bVar2 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar2 & 1) != 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"Failed to open file \"",&local_289);
    std::operator+(local_268,(char *)local_288);
    std::operator+(local_248,(char *)local_268);
    std::runtime_error::runtime_error(prVar5,(string *)local_248);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uStack_2a8 = 0xffaaaaaaffffffff;
  colors[0] = 0xff555555;
  colors[1] = 0xff000000;
  std::operator<<((ostream *)&local_218,"P3\n160 144\n255\n");
  _b = (gb->s).ppu_buffer;
  for (data._6_1_ = 0; data._6_1_ < 0x90; data._6_1_ = data._6_1_ + 1) {
    for (data._7_1_ = 0; data._7_1_ < 0xa0; data._7_1_ = data._7_1_ + 1) {
      uVar1 = *(uint *)(local_288 + (ulong)*_b * 4 + -0x20);
      _Var3 = std::setw(3);
      poVar4 = std::operator<<((ostream *)&local_218,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 & 0xff);
      poVar4 = std::operator<<(poVar4,' ');
      _Var3 = std::setw(3);
      poVar4 = std::operator<<(poVar4,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 >> 8 & 0xff);
      poVar4 = std::operator<<(poVar4,' ');
      _Var3 = std::setw(3);
      poVar4 = std::operator<<(poVar4,_Var3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 >> 0x10 & 0xff);
      std::operator<<(poVar4,' ');
      _b = _b + 1;
    }
    std::operator<<((ostream *)&local_218,'\n');
  }
  bVar2 = std::ios::bad();
  if ((bVar2 & 1) == 0) {
    std::ofstream::~ofstream(&local_218);
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"Failed to write file.");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteFramePPM(const GB& gb, const char* filename) {
  std::ofstream file(filename, std::ios::out);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }
  u32 colors[] = {0xffffffffu, 0xffaaaaaau, 0xff555555u, 0xff000000u};
  file << "P3\n160 144\n255\n";
  u8 x, y;
  const u8* data = gb.s.ppu_buffer;
  for (y = 0; y < 144; ++y) {
    for (x = 0; x < 160; ++x) {
      u32 pixel = colors[*data++];
      int b = (pixel >> 16) & 0xff;
      int g = (pixel >> 8) & 0xff;
      int r = (pixel >> 0) & 0xff;
      file << std::setw(3) << r << ' ' << std::setw(3) << g << ' '
           << std::setw(3) << b << ' ';
    }
    file << '\n';
  }
  if (file.bad()) {
    throw Error("Failed to write file.");
  }
}